

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O2

qsizetype __thiscall
QDecompressHelper::readInternal(QDecompressHelper *this,char *data,qsizetype maxSize)

{
  ContentEncoding CVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  long in_FS_OFFSET;
  qsizetype qStack_40;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((maxSize < 1) ||
     (((this->compressedDataBuffer).bufferCompleteSize == 0 && ((this->decoderHasData & 1U) == 0))))
  {
    qStack_40 = 0;
    goto LAB_001d28f5;
  }
  CVar1 = this->contentEncoding;
  if (CVar1 - Deflate < 2) {
    qStack_40 = readZLib(this,data,maxSize);
LAB_001d294a:
    if (qStack_40 == -1) goto LAB_001d2953;
  }
  else {
    if (CVar1 == Brotli) {
      qStack_40 = readBrotli(this,data,maxSize);
      goto LAB_001d294a;
    }
    if (CVar1 == Zstandard) {
      qStack_40 = readZstandard(this,data,maxSize);
      goto LAB_001d294a;
    }
LAB_001d2953:
    clear(this);
    qStack_40 = -1;
  }
  this->totalUncompressedBytes = this->totalUncompressedBytes + qStack_40;
  bVar5 = isPotentialArchiveBomb(this);
  if (bVar5) {
    qStack_40 = -1;
    QCoreApplication::translate
              ((char *)&local_38,"QHttp",
               "The decompressed output exceeds the limits specified by QNetworkRequest::decompressedSafetyCheckThreshold()"
               ,0);
    pDVar3 = (this->errorStr).d.d;
    pcVar4 = (this->errorStr).d.ptr;
    (this->errorStr).d.d = local_38.d;
    (this->errorStr).d.ptr = local_38.ptr;
    qVar2 = (this->errorStr).d.size;
    (this->errorStr).d.size = local_38.size;
    local_38.d = pDVar3;
    local_38.ptr = pcVar4;
    local_38.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
LAB_001d28f5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return qStack_40;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QDecompressHelper::readInternal(char *data, qsizetype maxSize)
{
    Q_ASSERT(isValid());

    if (maxSize <= 0)
        return 0;

    if (!hasDataInternal())
        return 0;

    qsizetype bytesRead = -1;
    switch (contentEncoding) {
    case None:
        Q_UNREACHABLE();
        break;
    case Deflate:
    case GZip:
        bytesRead = readZLib(data, maxSize);
        break;
    case Brotli:
        bytesRead = readBrotli(data, maxSize);
        break;
    case Zstandard:
        bytesRead = readZstandard(data, maxSize);
        break;
    }
    if (bytesRead == -1)
        clear();

    totalUncompressedBytes += bytesRead;
    if (isPotentialArchiveBomb()) {
        errorStr = QCoreApplication::translate(
                "QHttp",
                "The decompressed output exceeds the limits specified by "
                "QNetworkRequest::decompressedSafetyCheckThreshold()");
        return -1;
    }

    return bytesRead;
}